

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::disconnected(TlsCryptographOpenSSL *this)

{
  long *plVar1;
  long lVar2;
  TlsCryptographOpenSSL *in_RDI;
  qint64 tmpReadBufferMaxSize;
  QTcpSocket *plainSocket;
  
  plVar1 = (long *)QSslSocketPrivate::plainTcpSocket();
  QSslSocketPrivate::setEncrypted(SUB81(in_RDI->d,0));
  lVar2 = (**(code **)(*plVar1 + 0xa0))();
  if (lVar2 < 1) {
    destroySslContext(in_RDI);
  }
  else {
    QSslSocketPrivate::maxReadBufferSize();
    QSslSocketPrivate::setMaxReadBufferSize((longlong)in_RDI->d);
    (**(code **)(*(long *)in_RDI + 200))();
    QSslSocketPrivate::setMaxReadBufferSize((longlong)in_RDI->d);
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::disconnected()
{
    Q_ASSERT(d);
    auto *plainSocket = d->plainTcpSocket();
    Q_ASSERT(plainSocket);
    d->setEncrypted(false);

    if (plainSocket->bytesAvailable() <= 0) {
        destroySslContext();
    } else {
        // Move all bytes into the plain buffer.
        const qint64 tmpReadBufferMaxSize = d->maxReadBufferSize();
        // Reset temporarily, so the plain socket buffer is completely drained:
        d->setMaxReadBufferSize(0);
        transmit();
        d->setMaxReadBufferSize(tmpReadBufferMaxSize);
    }
    //if there is still buffered data in the plain socket, don't destroy the ssl context yet.
    //it will be destroyed when the socket is deleted.
}